

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlwrap.c
# Opt level: O2

void * dlopen(char *filename,int flag)

{
  char *__s;
  void *pvVar1;
  int iVar2;
  void *pvVar3;
  size_t __n;
  long lVar4;
  void *pvVar5;
  
  pvVar3 = dlwrap_real_dlopen(filename,flag);
  if (filename != (char *)0x0) {
    lVar4 = 4;
    pvVar1 = (void *)0x1050a8;
    do {
      pvVar5 = pvVar1;
      lVar4 = lVar4 + -1;
      if (lVar4 == 0) {
        return pvVar3;
      }
      __s = *(char **)((long)pvVar5 + 0x18);
      __n = strlen(__s);
      iVar2 = strncmp(__s,filename,__n);
      pvVar1 = (void *)((long)pvVar5 + 0x18);
    } while (iVar2 != 0);
    *(void **)((long)pvVar5 + 0x28) = pvVar3;
    pvVar3 = (void *)((long)pvVar5 + 0x18);
  }
  return pvVar3;
}

Assistant:

void *
dlopen(const char *filename, int flag)
{
    void *ret;
    struct libwrap *wrap;

    /* Before deciding whether to redirect this dlopen to our own
     * library, we call the real dlopen. This assures that any
     * expected side-effects from loading the intended library are
     * resolved. Below, we may still return a handle pointing to
     * our own library, and not what is opened here. */
    ret = dlwrap_real_dlopen(filename, flag);

    /* If filename is not a wrapped library, just return real dlopen */
    wrap = find_wrapped_library(filename);
    if (!wrap)
        return ret;

    wrap->handle = ret;

    /* We use wrapped_libs as our handles to libraries. */
    return wrap;
}